

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

size_t dumpManifest(IDManifest *mfst)

{
  int iVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  long *plVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr *pp_Var9;
  _Base_ptr p_Var10;
  ulong uVar11;
  bool bVar12;
  char cVar13;
  char *pcVar14;
  size_t c;
  ulong uVar15;
  size_t sVar16;
  size_t c_1;
  string __str;
  string s_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> componentLength;
  long *local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  ulong local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long *local_60;
  long local_58;
  long local_50 [2];
  IDManifest *local_40;
  ulong local_38;
  
  lVar3 = Imf_3_4::IDManifest::size();
  if (lVar3 == 0) {
    sVar16 = 0;
  }
  else {
    sVar16 = 0;
    uVar15 = 0;
    local_40 = mfst;
    do {
      lVar3 = Imf_3_4::IDManifest::operator[]((ulong)mfst);
      local_38 = uVar15;
      if (uVar15 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," channels  : ",0xd);
      lVar4 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
      p_Var5 = *(_Rb_tree_node_base **)(lVar4 + 0x18);
      lVar4 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
      if (p_Var5 != (_Rb_tree_node_base *)(lVar4 + 8)) {
        bVar12 = true;
        do {
          if (bVar12) {
            bVar12 = false;
          }
          else {
            local_c0 = (long *)CONCAT71(local_c0._1_7_,0x2c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&local_c0,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
          sVar16 = (long)&(p_Var5[1]._M_parent)->_M_color + sVar16 + 1;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          lVar4 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
        } while (p_Var5 != (_Rb_tree_node_base *)(lVar4 + 8));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n hashScheme: ",0xe);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(lVar3 + 0x50),*(long *)(lVar3 + 0x58));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," encoding  : ",0xd);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(lVar3 + 0x70),*(long *)(lVar3 + 0x78));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar1 = *(int *)(lVar3 + 0x48);
      if (iVar1 == 0) {
        lVar3 = 0x13;
        pcVar14 = " lifetime  : frame\n";
LAB_00102611:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,lVar3);
      }
      else {
        if (iVar1 == 1) {
          lVar3 = 0x12;
          pcVar14 = " lifetime  : shot\n";
          goto LAB_00102611;
        }
        if (iVar1 == 2) {
          lVar3 = 0x14;
          pcVar14 = " lifetime  : stable\n";
          goto LAB_00102611;
        }
      }
      plVar7 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_78,plVar7[1] - *plVar7 >> 5,(allocator_type *)&local_c0);
      lVar3 = 8;
      for (uVar15 = 0;
          plVar7 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_(),
          uVar15 < (ulong)(plVar7[1] - *plVar7 >> 5); uVar15 = uVar15 + 1) {
        plVar7 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
        uVar11 = *(ulong *)(*plVar7 + lVar3);
        sVar16 = sVar16 + uVar11 + 1;
        if (uVar11 < local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar15]) {
          uVar11 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15];
        }
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = uVar11;
        lVar3 = lVar3 + 0x20;
      }
      p_Var5 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::begin();
      local_80 = 0;
      for (; p_Var8 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::end(),
          p_Var5 != p_Var8; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        uVar15 = *(ulong *)(p_Var5 + 1);
        cVar13 = '\x01';
        if (9 < uVar15) {
          uVar11 = uVar15;
          cVar2 = '\x04';
          do {
            cVar13 = cVar2;
            if (uVar11 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_00102713;
            }
            if (uVar11 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_00102713;
            }
            if (uVar11 < 10000) goto LAB_00102713;
            bVar12 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar2 = cVar13 + '\x04';
          } while (bVar12);
          cVar13 = cVar13 + '\x01';
        }
LAB_00102713:
        local_c0 = local_b0;
        std::__cxx11::string::_M_construct((ulong)&local_c0,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c0,local_b8,uVar15);
        uVar15 = CONCAT44(uStack_b4,local_b8);
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        sVar16 = sVar16 + uVar15;
        if (local_80 <= uVar15) {
          local_80 = uVar15;
        }
        lVar3 = (long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent;
        if (lVar3 != 0) {
          lVar3 = lVar3 >> 5;
          pp_Var9 = &(p_Var5[1]._M_parent)->_M_parent;
          lVar4 = 0;
          do {
            p_Var10 = *pp_Var9;
            sVar16 = (long)&p_Var10->_M_color + sVar16 + 1;
            if (p_Var10 < (_Base_ptr)
                          local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar4]) {
              p_Var10 = (_Base_ptr)
                        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar4];
            }
            local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] = (unsigned_long)p_Var10;
            lVar4 = lVar4 + 1;
            pp_Var9 = pp_Var9 + 4;
          } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     ",5);
      local_80 = local_80 + 1;
      local_c0 = local_b0;
      std::__cxx11::string::_M_construct((ulong)&local_c0,(char)local_80);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_c0,CONCAT44(uStack_b4,local_b8));
      if (local_c0 != local_b0) {
        operator_delete(local_c0,local_b0[0] + 1);
      }
      lVar3 = 8;
      for (uVar15 = 0;
          plVar7 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_(),
          uVar15 < (ulong)(plVar7[1] - *plVar7 >> 5); uVar15 = uVar15 + 1) {
        plVar7 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
        local_c0 = local_b0;
        lVar4 = *(long *)(*plVar7 + -8 + lVar3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,lVar4,*(long *)(*plVar7 + lVar3) + lVar4);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_c0,CONCAT44(uStack_b4,local_b8));
        local_a0 = local_90;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_a0,
                   ((char)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15] - (char)local_b8) +
                   '\x01');
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_a0,local_98);
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        lVar3 = lVar3 + 0x20;
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      for (p_Var5 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::begin();
          p_Var8 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::end(),
          p_Var5 != p_Var8; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        uVar15 = *(ulong *)(p_Var5 + 1);
        cVar13 = '\x01';
        if (9 < uVar15) {
          uVar11 = uVar15;
          cVar2 = '\x04';
          do {
            cVar13 = cVar2;
            if (uVar11 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_001029c2;
            }
            if (uVar11 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_001029c2;
            }
            if (uVar11 < 10000) goto LAB_001029c2;
            bVar12 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar2 = cVar13 + '\x04';
          } while (bVar12);
          cVar13 = cVar13 + '\x01';
        }
LAB_001029c2:
        local_c0 = local_b0;
        std::__cxx11::string::_M_construct((ulong)&local_c0,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c0,local_b8,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     ",5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_c0,CONCAT44(uStack_b4,local_b8));
        local_a0 = local_90;
        std::__cxx11::string::_M_construct((ulong)&local_a0,(char)local_80 - (char)local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_a0,local_98);
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
        p_Var10 = p_Var5[1]._M_parent;
        if (p_Var5[1]._M_left != p_Var10) {
          lVar3 = 8;
          uVar15 = 0;
          do {
            lVar4 = *(long *)((long)p_Var10 + lVar3 + -8);
            local_a0 = local_90;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,lVar4,*(long *)((long)&p_Var10->_M_color + lVar3) + lVar4
                      );
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_a0,local_98);
            local_60 = local_50;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_60,
                       ((char)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar15] - (char)local_98) +
                       '\x01');
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_60,local_58);
            if (local_60 != local_50) {
              operator_delete(local_60,local_50[0] + 1);
            }
            if (local_a0 != local_90) {
              operator_delete(local_a0,local_90[0] + 1);
            }
            uVar15 = uVar15 + 1;
            p_Var10 = p_Var5[1]._M_parent;
            lVar3 = lVar3 + 0x20;
          } while (uVar15 < (ulong)((long)p_Var5[1]._M_left - (long)p_Var10 >> 5));
        }
        local_a0 = (long *)CONCAT71(local_a0._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_a0,1);
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
      }
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      mfst = local_40;
      uVar15 = local_38 + 1;
      uVar11 = Imf_3_4::IDManifest::size();
    } while (uVar15 < uVar11);
  }
  return sVar16;
}

Assistant:

size_t
dumpManifest (const IDManifest& mfst)
{

    size_t uncompressedSize = 0;

    for (size_t i = 0; i < mfst.size (); ++i)
    {
        const IDManifest::ChannelGroupManifest& m     = mfst[i];
        bool                                    first = true;
        if (i > 0) { cout << "\n\n"; }
        cout << " channels  : ";
        for (set<string>::const_iterator s = m.getChannels ().begin ();
             s != m.getChannels ().end ();
             ++s)
        {
            if (!first) { cout << ','; }
            else { first = false; }

            cout << *s;
            uncompressedSize += s->size () + 1;
        }

        cout << "\n hashScheme: " << m.getHashScheme () << endl;
        cout << " encoding  : " << m.getEncodingScheme () << endl;
        switch (m.getLifetime ())
        {
            case IDManifest::LIFETIME_FRAME:
                cout << " lifetime  : frame\n";
                break;
            case IDManifest::LIFETIME_SHOT:
                cout << " lifetime  : shot\n";
                break;
            case IDManifest::LIFETIME_STABLE:
                cout << " lifetime  : stable\n";
                break;
        }

        //
        // compute max field sizes
        //
        size_t         maxNumLen = 0;
        vector<size_t> componentLength (m.getComponents ().size ());
        for (size_t c = 0; c < m.getComponents ().size (); ++c)
        {
            size_t componentSize = m.getComponents ()[c].size ();
            uncompressedSize += componentSize + 1;
            componentLength[c] = max (componentLength[c], componentSize);
        }
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {

            size_t stringLen = to_string (q.id ()).size ();
            uncompressedSize += stringLen;
            maxNumLen = max (maxNumLen, stringLen);

            for (size_t i = 0; i < q.text ().size (); i++)
            {
                uncompressedSize += q.text ()[i].size () + 1;
                componentLength[i] =
                    max (componentLength[i], q.text ()[i].size ());
            }
        }

        cout << "     " << string (maxNumLen + 1, ' ');
        for (size_t c = 0; c < m.getComponents ().size (); ++c)
        {
            string s = m.getComponents ()[c];
            cout << s << string (componentLength[c] + 1 - s.size (), ' ');
        }
        cout << endl;
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {
            string id = to_string (q.id ());
            cout << "     " << id << string (maxNumLen + 1 - id.size (), ' ');
            for (size_t i = 0; i < q.text ().size (); i++)
            {
                string s = q.text ()[i];
                cout << s << string (componentLength[i] + 1 - s.size (), ' ');
            }
            cout << '\n';
        }
    }

    return uncompressedSize;
}